

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<std::complex<long_double>_> * __thiscall
TPZVec<std::complex<long_double>_>::operator=
          (TPZVec<std::complex<long_double>_> *this,TPZVec<std::complex<long_double>_> *rval)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  complex<long_double> *pcVar4;
  complex<long_double> *pcVar5;
  TPZVec<std::complex<long_double>_> *in_RSI;
  TPZVec<std::complex<long_double>_> *in_RDI;
  int64_t i;
  complex<long_double> *local_58;
  long local_28;
  
  if (in_RDI != in_RSI) {
    in_RDI->fNElements = in_RSI->fNElements;
    if ((in_RDI->fStore != (complex<long_double> *)0x0) &&
       (in_RDI->fStore != (complex<long_double> *)0x0)) {
      operator_delete__(in_RDI->fStore);
    }
    if (in_RSI->fNAlloc == 0) {
      uVar1 = in_RDI->fNElements;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar1;
      uVar3 = SUB168(auVar2 * ZEXT816(0x20),0);
      if (SUB168(auVar2 * ZEXT816(0x20),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pcVar4 = (complex<long_double> *)operator_new__(uVar3);
      if (uVar1 != 0) {
        local_58 = pcVar4;
        do {
          std::complex<long_double>::complex(local_58,(longdouble)0,(longdouble)0);
          local_58 = local_58 + 1;
        } while (local_58 != pcVar4 + uVar1);
      }
      in_RDI->fStore = pcVar4;
      for (local_28 = 0; local_28 < in_RDI->fNElements; local_28 = local_28 + 1) {
        pcVar5 = in_RSI->fStore + local_28;
        pcVar4 = in_RDI->fStore + local_28;
        *(undefined8 *)pcVar4->_M_value = *(undefined8 *)pcVar5->_M_value;
        *(undefined8 *)(pcVar4->_M_value + 8) = *(undefined8 *)(pcVar5->_M_value + 8);
        *(undefined8 *)(pcVar4->_M_value + 0x10) = *(undefined8 *)(pcVar5->_M_value + 0x10);
        *(undefined8 *)(pcVar4->_M_value + 0x18) = *(undefined8 *)(pcVar5->_M_value + 0x18);
      }
    }
    else {
      in_RDI->fStore = in_RSI->fStore;
    }
    in_RDI->fNAlloc = in_RDI->fNElements;
    in_RSI->fStore = (complex<long_double> *)0x0;
    in_RSI->fNElements = 0;
    in_RSI->fNAlloc = 0;
  }
  return in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}